

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffnkey(int value,char *keyroot,char *keyname,int *status)

{
  size_t sVar1;
  size_t sVar2;
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  uint in_EDI;
  size_t rootlen;
  int local_4;
  
  *in_RDX = '\0';
  sVar1 = strlen(in_RSI);
  if (((sVar1 == 0) || (7 < sVar1)) || ((int)in_EDI < 0)) {
    *in_RCX = 0xce;
    local_4 = 0xce;
  }
  else {
    snprintf(in_RDX,0x47,"%d",(ulong)in_EDI);
    sVar2 = strlen(in_RDX);
    if (sVar1 + sVar2 < 9) {
      strcat(in_RDX,in_RSI);
      local_4 = *in_RCX;
    }
    else {
      *in_RCX = 0xce;
      local_4 = 0xce;
    }
  }
  return local_4;
}

Assistant:

int ffnkey(int value,       /* I - index number to be appended to root name */
           const char *keyroot,   /* I - root string for keyword name */
           char *keyname,   /* O - output root + index keyword name */
           int *status)     /* IO - error status  */
/*
  Construct a keyword name string by appending the root string to the index
  number. e.g., if root = "TTYPE" and value = 12 then keyname = "12TTYPE".
*/
{
    size_t rootlen;

    keyname[0] = '\0';            /* initialize output name to null */
    rootlen = strlen(keyroot);

    if (rootlen == 0 || rootlen > 7 || value < 0 )
       return(*status = 206);

    snprintf(keyname, FLEN_VALUE,"%d", value); /* construct keyword prefix */

    if (rootlen +  strlen(keyname) > 8)
       return(*status = 206);

    strcat(keyname, keyroot);  /* append root to the prefix */
    return(*status);
}